

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  secp256k1_context *error_callback;
  char **ppcVar7;
  int iVar8;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  secp256k1_scalar sVar13;
  int iVar14;
  ulong uVar15;
  FILE *__stream;
  size_t sVar16;
  secp256k1_ge *psVar17;
  secp256k1_gej *psVar18;
  secp256k1_gej *psVar19;
  secp256k1_context *ctx;
  secp256k1_scratch *scratch;
  size_t sVar20;
  uchar *puVar21;
  secp256k1_ge *psVar22;
  time_t tVar23;
  undefined4 uVar24;
  secp256k1_fe *psVar25;
  uint64_t uVar26;
  void *pvVar27;
  void *cbdata;
  secp256k1_ecdsa_signature *sig;
  int j;
  uint uVar28;
  long lVar29;
  secp256k1_gej *gen;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *extraout_RDX_00;
  ulong uVar30;
  char *pcVar31;
  secp256k1_gej *psVar32;
  secp256k1_ge_storage (*r_00) [2];
  secp256k1_keypair *keypair;
  uint uVar33;
  ulong uVar34;
  uint64_t *puVar35;
  uint64_t *puVar36;
  uchar *pubkey32;
  code *sig_00;
  char *pcVar37;
  ulong uVar38;
  uint uVar39;
  secp256k1_scalar sVar40;
  secp256k1_scalar *output32;
  uint uVar41;
  uint uVar42;
  secp256k1_gej *a;
  int pos;
  long lVar43;
  secp256k1_xonly_pubkey *pubkey;
  size_t sVar44;
  bool bVar45;
  byte bVar46;
  undefined1 auVar47 [16];
  undefined8 uStack_1b10;
  secp256k1_keypair *local_1b00;
  long local_1af8;
  secp256k1_scalar msg_plus_r_times_sk_s;
  secp256k1_gej *local_1ae0;
  secp256k1_ge *local_1ad8;
  secp256k1_gej *local_1ad0;
  secp256k1_context *local_1ac8;
  undefined8 uStack_1ac0;
  secp256k1_scalar expected_r;
  secp256k1_scalar expected_r_1;
  int recid;
  secp256k1_scalar g_sc;
  undefined4 uStack_1aa4;
  uint64_t uStack_1aa0;
  undefined4 local_1a98;
  undefined4 uStack_1a94;
  undefined4 uStack_1a90;
  undefined4 uStack_1a8c;
  secp256k1_scalar s;
  secp256k1_nonce_function_hardened p_Stack_1a70;
  secp256k1_scalar *local_1a68;
  secp256k1_scalar sStack_1a5c;
  uint64_t iter_1;
  secp256k1_ge *psStack_1a50;
  secp256k1_strauss_point_state *local_1a48;
  uint64_t uStack_1a40;
  uint64_t local_1a38;
  uint64_t uStack_1a30;
  undefined4 local_1a28;
  int iStack_1a1c;
  uint64_t iter_2;
  void *pvStack_1a10;
  undefined4 local_1a08;
  undefined4 uStack_1a04;
  undefined4 uStack_1a00;
  undefined4 uStack_19fc;
  int local_19f8;
  undefined4 uStack_19f4;
  int iStack_19f0;
  int iStack_19ec;
  long local_19e8;
  long local_19e0;
  char **local_19d8;
  int local_19cc;
  secp256k1_scalar r;
  uint64_t local_19a8;
  secp256k1_scratch *local_19a0;
  long local_1998;
  uint64_t local_1990;
  secp256k1_ge *local_1988;
  uint64_t local_1980;
  secp256k1_gej *local_1978;
  ulong local_1970;
  void *local_1968;
  ulong local_1960;
  uint64_t iter;
  uint64_t uStack_1950;
  uchar local_1948 [4];
  uchar auStack_1944 [4];
  uchar auStack_1940 [4];
  uchar auStack_193c [4];
  uchar local_1938 [16];
  _func_void_char_ptr_void_ptr *local_1928;
  void *pvStack_1920;
  uchar rand32 [32];
  secp256k1_scalar scalar_i;
  uint64_t uStack_17b0;
  uchar local_17a8 [4];
  uchar auStack_17a4 [4];
  uchar auStack_17a0 [4];
  uchar auStack_179c [4];
  uchar local_1798 [4];
  uchar auStack_1794 [4];
  int iStack_1790;
  int iStack_178c;
  secp256k1_ge generated;
  secp256k1_scalar half;
  byte bStack_11b4;
  byte bStack_11b3;
  byte bStack_11b2;
  byte bStack_11b1;
  undefined8 uStack_11b0;
  uint64_t local_1148 [130];
  secp256k1_ge group [13];
  undefined1 auStack_7f0 [8];
  secp256k1_gej groupj [13];
  
  bVar46 = 0;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (argc < 2) {
    uVar15 = (ulong)(uint)count;
  }
  else {
    uVar15 = strtol(argv[1],(char **)0x0,0);
    count = (int)uVar15;
  }
  printf("test count = %i\n",uVar15);
  local_19d8 = argv;
  if (argc < 3) {
LAB_0010a056:
    _half = (undefined1  [16])0x0;
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) {
      local_1ac8 = (secp256k1_context *)0x0;
LAB_0010c584:
      uStack_1ac0 = 0;
      tVar23 = time((time_t *)0x0);
      fwrite("WARNING: could not read 16 bytes from /dev/urandom; falling back to insecure PRNG\n",
             0x52,1,_stderr);
      uVar15 = tVar23 * 0x539;
      _half = (uVar15 & 0xffffffff | (uVar15 >> 0x20 & 0xffff) << 0x20 |
              (ulong)(ushort)((ushort)(byte)(uVar15 >> 0x38) << 8 | (ushort)(uVar15 >> 0x30) & 0xff)
              << 0x30) ^ (ulong)local_1ac8;
      if (__stream == (FILE *)0x0) goto LAB_0010a09d;
    }
    else {
      sVar16 = fread(&half,1,0x10,__stream);
      if (sVar16 != 0x10) {
        local_1ac8 = (secp256k1_context *)_half;
        goto LAB_0010c584;
      }
    }
    fclose(__stream);
  }
  else {
    pcVar31 = argv[2];
    _half = (undefined1  [16])0x0;
    if ((pcVar31 == (char *)0x0) || (*pcVar31 == '\0')) goto LAB_0010a056;
    lVar43 = 0;
    while ((((lVar43 != 0x10 && (pcVar37 = pcVar31 + lVar43 * 2, *pcVar37 != '\0')) &&
            (pcVar37[1] != '\0')) && (iVar8 = __isoc99_sscanf(pcVar37,"%2hx",groupj), iVar8 == 1)))
    {
      *(undefined1 *)((long)&half + lVar43) = (undefined1)groupj[0].x.n[0];
      lVar43 = lVar43 + 1;
    }
  }
LAB_0010a09d:
  psVar25 = (secp256k1_fe *)(ulong)half._2_1_;
  pubkey32 = (uchar *)(ulong)half._3_1_;
  local_1ac8 = (secp256k1_context *)(ulong)bStack_11b3;
  local_1ad0 = (secp256k1_gej *)(ulong)bStack_11b1;
  local_1ae0 = (secp256k1_gej *)(ulong)(byte)uStack_11b0;
  local_1ad8 = (secp256k1_ge *)(ulong)uStack_11b0._1_1_;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         (ulong)(byte)half,(ulong)half._1_1_);
  groupj[0].x.n[0] = 0xbb67ae856a09e667;
  groupj[0].x.n[1] = 0xa54ff53a3c6ef372;
  groupj[0].x.n[2] = 0x9b05688c510e527f;
  groupj[0].x.n[3] = 0x5be0cd191f83d9ab;
  groupj[0].z.n[0] = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)&half,0x10);
  psVar17 = group;
  secp256k1_sha256_finalize((secp256k1_sha256 *)groupj,(uchar *)psVar17);
  ppcVar7 = local_19d8;
  for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
    psVar25 = (secp256k1_fe *)0x0;
    for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
      psVar25 = (secp256k1_fe *)
                ((long)psVar25 << 8 | (ulong)*(byte *)((long)(psVar17->x).n + lVar29));
    }
    secp256k1_test_state[lVar43] = (uint64_t)psVar25;
    psVar17 = (secp256k1_ge *)((psVar17->x).n + 1);
  }
  if (4 < argc) {
    lVar43 = strtol(local_19d8[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar43;
    uVar15 = strtol(ppcVar7[4],(char **)0x0,0);
    this_core = (uint32_t)uVar15;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
      fprintf(_stderr,"Usage: %s [count] [seed] [numcores] [thiscore]\n",*ppcVar7);
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar15 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar17 = (secp256k1_ge *)checked_malloc(&default_error_callback,0xd0);
  psVar18 = (secp256k1_gej *)checked_malloc(&default_error_callback,0x130);
  psVar19 = (secp256k1_gej *)checked_malloc(&default_error_callback,0x130);
  secp256k1_scalar_half(&half,&secp256k1_scalar_one);
  secp256k1_gej_set_infinity(groupj);
  for (uVar33 = 0xff; -1 < (int)uVar33; uVar33 = uVar33 - 1) {
    secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
    uVar9 = secp256k1_scalar_get_bits_limb32(&half,uVar33,1);
    if (uVar9 != 0) {
      psVar25 = (secp256k1_fe *)0x0;
      secp256k1_gej_add_ge_var(groupj,groupj,&secp256k1_ge_const_g,(secp256k1_fe *)0x0);
    }
  }
  secp256k1_gej_double_var((secp256k1_gej *)group,groupj,(secp256k1_fe *)0x0);
  iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)group,&secp256k1_ge_const_g);
  if (iVar8 == 0) {
    pcVar31 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_gen_compute_table_impl.h"
    ;
    pcVar37 = "test condition failed: secp256k1_gej_eq_ge_var(&double_u, gen)";
LAB_0010c9ff:
    uStack_1b10 = 0x2d;
  }
  else {
    bVar45 = true;
    lVar43 = 0;
    while (bVar45) {
      secp256k1_gej_set_infinity((secp256k1_gej *)group);
      for (lVar29 = -0x98; lVar29 != 0x98; lVar29 = lVar29 + 0x98) {
        secp256k1_gej_add_var((secp256k1_gej *)group,(secp256k1_gej *)group,groupj,psVar25);
        secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
        memcpy((void *)((long)psVar18[1].x.n + lVar29),groupj,0x98);
        if (lVar29 != 0) {
          secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
        }
      }
      lVar29 = lVar43 + 1;
      secp256k1_gej_neg(psVar19 + lVar43,(secp256k1_gej *)group);
      bVar45 = true;
      while (bVar45) {
        psVar32 = psVar19 + lVar29;
        for (lVar43 = 0; (int)lVar43 != 1; lVar43 = lVar43 + 1) {
          secp256k1_gej_add_var(psVar32,psVar32 + -1,psVar18,psVar25);
          psVar32 = psVar32 + 1;
        }
        lVar29 = lVar29 + lVar43;
        bVar45 = false;
      }
      bVar45 = false;
      lVar43 = lVar29;
    }
    if (lVar43 == 2) {
      for (lVar43 = 0; lVar43 != 0x130; lVar43 = lVar43 + 0x98) {
        secp256k1_gej_verify((secp256k1_gej *)((long)(psVar19->x).n + lVar43));
      }
      psVar25 = &psVar19->z;
      lVar43 = -1;
      psVar22 = psVar17;
      for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
        if ((int)psVar25[1].n[0] == 0) {
          if (lVar43 == -1) {
            uVar26 = psVar25->n[0];
            uVar4 = psVar25->n[1];
            uVar5 = psVar25->n[2];
            uVar24 = *(undefined4 *)((long)psVar25->n + 0x14);
            uVar6 = psVar25->n[3];
            uVar2 = *(undefined4 *)((long)psVar25->n + 0x1c);
            uVar3 = *(undefined4 *)((long)psVar25->n + 0x24);
            iVar8 = psVar25->magnitude;
            iVar10 = psVar25->normalized;
            *(int *)((psVar22->x).n + 4) = (int)psVar25->n[4];
            *(undefined4 *)((long)(psVar22->x).n + 0x24) = uVar3;
            (psVar22->x).magnitude = iVar8;
            (psVar22->x).normalized = iVar10;
            *(int *)((psVar22->x).n + 2) = (int)uVar5;
            *(undefined4 *)((long)(psVar22->x).n + 0x14) = uVar24;
            *(int *)((psVar22->x).n + 3) = (int)uVar6;
            *(undefined4 *)((long)(psVar22->x).n + 0x1c) = uVar2;
            (psVar22->x).n[0] = uVar26;
            (psVar22->x).n[1] = uVar4;
            lVar43 = lVar29;
          }
          else {
            secp256k1_fe_mul(&psVar22->x,&psVar17[lVar43].x,psVar25);
            lVar43 = lVar29;
          }
        }
        else {
          secp256k1_ge_set_infinity(psVar22);
        }
        psVar22 = psVar22 + 1;
        psVar25 = (secp256k1_fe *)(psVar25[3].n + 1);
      }
      if (lVar43 != -1) {
        secp256k1_fe_inv_var(&group[0].x,&psVar17[lVar43].x);
        bVar45 = lVar43 == 0;
        while ((!bVar45 && (psVar19->infinity == 0))) {
          secp256k1_fe_mul(&psVar17[lVar43].x,(secp256k1_fe *)psVar17,&group[0].x);
          secp256k1_fe_mul(&group[0].x,&group[0].x,&psVar19[lVar43].z);
          bVar45 = true;
          lVar43 = 0;
        }
        if (psVar19[lVar43].infinity != 0) {
          pcVar31 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/group_impl.h"
          ;
          pcVar37 = "test condition failed: !a[last_i].infinity";
          uStack_1b10 = 0xeb;
          goto LAB_0010c895;
        }
        psVar25 = &psVar17[lVar43].x;
        *(undefined4 *)(psVar25->n + 4) = (undefined4)group[0].x.n[4];
        *(undefined4 *)((long)psVar25->n + 0x24) = group[0].x.n[4]._4_4_;
        *(int *)(psVar25->n + 4 + 1) = group[0].x.magnitude;
        psVar25->normalized = group[0].x.normalized;
        psVar25 = &psVar17[lVar43].x;
        *(undefined4 *)(psVar25->n + 2) = (undefined4)group[0].x.n[2];
        *(undefined4 *)((long)psVar25->n + 0x14) = group[0].x.n[2]._4_4_;
        *(undefined4 *)(psVar25->n + 2 + 1) = (undefined4)group[0].x.n[3];
        *(undefined4 *)((long)psVar25->n + 0x1c) = group[0].x.n[3]._4_4_;
        psVar17[lVar43].x.n[0] = group[0].x.n[0];
        psVar17[lVar43].x.n[1] = group[0].x.n[1];
        psVar32 = psVar19;
        for (lVar43 = 0; lVar43 != 0xd0; lVar43 = lVar43 + 0x68) {
          if (psVar32->infinity == 0) {
            psVar22 = (secp256k1_ge *)((long)(psVar17->x).n + lVar43);
            secp256k1_ge_set_gej_zinv(psVar22,psVar32,(secp256k1_fe *)psVar22);
          }
          psVar32 = psVar32 + 1;
        }
        for (lVar43 = 0; lVar43 != 0xd0; lVar43 = lVar43 + 0x68) {
          secp256k1_ge_verify((secp256k1_ge *)((long)(psVar17->x).n + lVar43));
        }
      }
      r_00 = secp256k1_ecmult_gen_prec_table;
      for (lVar43 = 0; lVar43 != 0xd0; lVar43 = lVar43 + 0x68) {
        psVar22 = (secp256k1_ge *)((long)(psVar17->x).n + lVar43);
        iVar8 = secp256k1_ge_is_infinity(psVar22);
        if (iVar8 != 0) {
          pcVar31 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_gen_compute_table_impl.h"
          ;
          pcVar37 = 
          "test condition failed: !secp256k1_ge_is_infinity(&prec[block * points + index])";
          uStack_1b10 = 0x61;
          goto LAB_0010c895;
        }
        secp256k1_ge_to_storage(*r_00,psVar22);
        r_00 = (secp256k1_ge_storage (*) [2])((long)r_00 + 0x40);
      }
      free(psVar19);
      free(psVar18);
      free(psVar17);
      secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
      secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)groupj,gen);
      iVar8 = 0x80;
      psVar18 = extraout_RDX;
      while (bVar45 = iVar8 != 0, iVar8 = iVar8 + -1, bVar45) {
        secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
        psVar18 = extraout_RDX_00;
      }
      secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)groupj,psVar18);
      do {
        bVar45 = count == 0;
        count = count + -1;
        if (bVar45) {
          testrand256((uchar *)&half);
          local_1ac8 = (secp256k1_context *)(ulong)bStack_11b2;
          local_1ad0 = (secp256k1_gej *)(ulong)(byte)uStack_11b0;
          printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
                 (ulong)(byte)half,(ulong)half._1_1_,(ulong)half._2_1_,(ulong)half._3_1_,
                 (ulong)bStack_11b4,(ulong)bStack_11b3,local_1ac8,(ulong)bStack_11b1,local_1ad0,
                 (ulong)uStack_11b0._1_1_,(ulong)uStack_11b0._2_1_,(ulong)uStack_11b0._3_1_,
                 (ulong)uStack_11b0._4_1_,(ulong)uStack_11b0._5_1_,(ulong)uStack_11b0._6_1_,
                 (ulong)uStack_11b0._7_1_);
          puts("no problems found");
          return 0;
        }
        uVar33 = 1;
        ctx = secp256k1_context_create(1);
        testrand256(rand32);
        iVar8 = secp256k1_context_randomize(ctx,rand32);
        if (iVar8 == 0) {
          pcVar31 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
          ;
          pcVar37 = "test condition failed: secp256k1_context_randomize(ctx, rand32)";
          uStack_1b10 = 399;
          goto LAB_0010c895;
        }
        local_1ac8 = ctx;
        secp256k1_gej_set_infinity(groupj);
        secp256k1_ge_set_gej(group,groupj);
        psVar18 = groupj;
        for (lVar43 = -0x4e0; lVar43 != 0; lVar43 = lVar43 + 0x68) {
          psVar19 = psVar18 + 1;
          secp256k1_gej_add_ge(psVar19,psVar18,&secp256k1_ge_const_g);
          secp256k1_ge_set_gej((secp256k1_ge *)(auStack_7f0 + lVar43),psVar19);
          if (count != 0) {
            testutil_random_fe((secp256k1_fe *)&half);
            secp256k1_gej_rescale(psVar19,(secp256k1_fe *)&half);
          }
          secp256k1_scalar_set_int(&scalar_i,uVar33);
          secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)&half,&scalar_i);
          secp256k1_ge_set_gej(&generated,(secp256k1_gej *)&half);
          if (*(int *)((long)groupj[0].y.n + lVar43 + 0x28) != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = "test condition failed: group[i].infinity == 0";
            uStack_1b10 = 0x1a9;
            goto LAB_0010c895;
          }
          if (generated.infinity != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = "test condition failed: generated.infinity == 0";
            uStack_1b10 = 0x1aa;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_fe_equal(&generated.x,(secp256k1_fe *)(auStack_7f0 + lVar43));
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = "test condition failed: secp256k1_fe_equal(&generated.x, &group[i].x)";
            uStack_1b10 = 0x1ab;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_fe_equal(&generated.y,
                                     (secp256k1_fe *)((long)groupj[0].x.n + lVar43 + 0x28));
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = "test condition failed: secp256k1_fe_equal(&generated.y, &group[i].y)";
            uStack_1b10 = 0x1ac;
            goto LAB_0010c895;
          }
          uVar33 = uVar33 + 1;
          psVar18 = psVar19;
        }
        uVar15 = 0;
        psVar17 = group;
        for (lVar43 = 0; lVar43 != 0x548; lVar43 = lVar43 + 0x68) {
          secp256k1_ge_mul_lambda
                    ((secp256k1_ge *)&half,(secp256k1_ge *)((long)group[0].x.n + lVar43));
          iVar8 = secp256k1_ge_eq_var(psVar17 + (uVar15 / 0xd) * -0xd,(secp256k1_ge *)&half);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_ge_eq_var(&group[i * EXHAUSTIVE_TEST_LAMBDA % EXHAUSTIVE_TEST_ORDER], &res)"
            ;
LAB_0010c7da:
            uStack_1b10 = 0x46;
            goto LAB_0010c895;
          }
          psVar17 = psVar17 + 9;
          uVar15 = uVar15 + 9;
        }
        iter = 0;
        iVar8 = secp256k1_ge_is_infinity(group);
        if (iVar8 == 0) {
          pcVar31 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
          ;
          pcVar37 = "test condition failed: secp256k1_ge_is_infinity(&group[0])";
          uStack_1b10 = 0x4f;
          goto LAB_0010c895;
        }
        iVar8 = secp256k1_gej_is_infinity(groupj);
        if (iVar8 == 0) {
          pcVar31 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
          ;
          pcVar37 = "test condition failed: secp256k1_gej_is_infinity(&groupj[0])";
          uStack_1b10 = 0x50;
          goto LAB_0010c895;
        }
        psVar18 = groupj;
        lVar43 = 0x68;
        while( true ) {
          psVar18 = psVar18 + 1;
          if (lVar43 + 0x68 == 0x5b0) break;
          iVar8 = secp256k1_ge_is_infinity((secp256k1_ge *)((long)group[0].x.n + lVar43));
          if (iVar8 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = "test condition failed: !secp256k1_ge_is_infinity(&group[i])";
            uStack_1b10 = 0x52;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_gej_is_infinity(psVar18);
          lVar43 = lVar43 + 0x68;
          if (iVar8 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = "test condition failed: !secp256k1_gej_is_infinity(&groupj[i])";
            uStack_1b10 = 0x53;
            goto LAB_0010c895;
          }
        }
        local_1ad8 = group;
        psVar18 = (secp256k1_gej *)0x0;
        while (psVar18 != (secp256k1_gej *)0xd) {
          local_1ae0 = psVar18;
          iVar8 = skip_section(&iter);
          psVar18 = local_1ae0;
          if (iVar8 == 0) {
            psVar32 = groupj + (long)local_1ae0;
            secp256k1_fe_inv((secp256k1_fe *)&scalar_i,&groupj[(long)local_1ae0].z);
            psVar17 = local_1ad8;
            psVar19 = psVar18;
            for (lVar43 = 0; lVar43 != 0x7b8; lVar43 = lVar43 + 0x98) {
              psVar22 = psVar17 + ((ulong)psVar19 / 0xd) * -0xd;
              a = (secp256k1_gej *)((long)groupj[0].x.n + lVar43);
              secp256k1_gej_add_var((secp256k1_gej *)&half,a,psVar32,(secp256k1_fe *)0xd);
              iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,psVar22);
              if (iVar8 == 0) {
                pcVar31 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                ;
                pcVar37 = 
                "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                ;
                uStack_1b10 = 0x60;
                goto LAB_0010c895;
              }
              local_1ad0 = psVar19;
              if (local_1ae0 != (secp256k1_gej *)0x0) {
                secp256k1_gej_add_ge((secp256k1_gej *)&half,a,group + (long)psVar18);
                iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,psVar22);
                if (iVar8 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = 
                  "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                  ;
                  uStack_1b10 = 100;
                  goto LAB_0010c895;
                }
              }
              secp256k1_gej_add_ge_var
                        ((secp256k1_gej *)&half,a,group + (long)psVar18,(secp256k1_fe *)0x0);
              iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,psVar22);
              if (iVar8 == 0) {
                pcVar31 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                ;
                pcVar37 = 
                "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                ;
                uStack_1b10 = 0x68;
                goto LAB_0010c895;
              }
              generated.infinity = groupj[(long)psVar18].infinity;
              generated.x.n[4] = groupj[(long)psVar18].x.n[4];
              generated.x.magnitude = groupj[(long)psVar18].x.magnitude;
              generated.x.normalized = groupj[(long)psVar18].x.normalized;
              generated.x.n[2] = groupj[(long)psVar18].x.n[2];
              generated.x.n[3] = groupj[(long)psVar18].x.n[3];
              generated.x.n[0] = (psVar32->x).n[0];
              generated.x.n[1] = groupj[(long)psVar18].x.n[1];
              generated.y.n[0] = groupj[(long)psVar18].y.n[0];
              generated.y.n[1] = groupj[(long)psVar18].y.n[1];
              generated.y.n[2]._0_4_ = (undefined4)groupj[(long)psVar18].y.n[2];
              generated.y.n[2]._4_4_ = *(undefined4 *)((long)groupj[(long)psVar18].y.n + 0x14);
              generated.y.n[3]._0_4_ = (undefined4)groupj[(long)psVar18].y.n[3];
              generated.y.n[3]._4_4_ = *(undefined4 *)((long)groupj[(long)psVar18].y.n + 0x1c);
              generated.y.n[4]._0_4_ = (undefined4)groupj[(long)psVar18].y.n[4];
              generated.y.n[4]._4_4_ = *(undefined4 *)((long)groupj[(long)psVar18].y.n + 0x24);
              generated.y.magnitude = groupj[(long)psVar18].y.magnitude;
              generated.y.normalized = groupj[(long)psVar18].y.normalized;
              secp256k1_gej_add_zinv_var
                        ((secp256k1_gej *)&half,a,&generated,(secp256k1_fe *)&scalar_i);
              iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,psVar22);
              if (iVar8 == 0) {
                pcVar31 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                ;
                pcVar37 = 
                "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                ;
                uStack_1b10 = 0x6e;
                goto LAB_0010c895;
              }
              psVar17 = psVar17 + 1;
              psVar19 = (secp256k1_gej *)((long)(local_1ad0->x).n + 1);
            }
          }
          local_1ad8 = local_1ad8 + 1;
          psVar18 = (secp256k1_gej *)((long)(local_1ae0->x).n + 1);
        }
        psVar18 = groupj;
        uVar33 = 0;
        for (uVar15 = 0; uVar15 != 0xd; uVar15 = uVar15 + 1) {
          secp256k1_gej_double((secp256k1_gej *)&half,psVar18);
          uVar39 = uVar33 - 0xd;
          if (uVar15 < 7) {
            uVar39 = uVar33;
          }
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,group + uVar39);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(2 * i) % EXHAUSTIVE_TEST_ORDER])"
            ;
            uStack_1b10 = 0x76;
            goto LAB_0010c895;
          }
          secp256k1_gej_double_var((secp256k1_gej *)&half,psVar18,(secp256k1_fe *)0x0);
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,group + uVar39);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(2 * i) % EXHAUSTIVE_TEST_ORDER])"
            ;
            uStack_1b10 = 0x78;
            goto LAB_0010c895;
          }
          uVar33 = uVar33 + 2;
          psVar18 = psVar18 + 1;
        }
        psVar17 = group + 0xc;
        psVar18 = groupj;
        for (lVar43 = 0x68; psVar18 = psVar18 + 1, lVar43 != 0x548; lVar43 = lVar43 + 0x68) {
          secp256k1_ge_neg(&generated,(secp256k1_ge *)((long)group[0].x.n + lVar43));
          iVar8 = secp256k1_ge_eq_var(&generated,psVar17);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_ge_eq_var(&tmp, &group[EXHAUSTIVE_TEST_ORDER - i])";
            uStack_1b10 = 0x80;
            goto LAB_0010c895;
          }
          secp256k1_gej_neg((secp256k1_gej *)&half,psVar18);
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,psVar17);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_gej_eq_ge_var(&tmpj, &group[EXHAUSTIVE_TEST_ORDER - i])"
            ;
            uStack_1b10 = 0x82;
            goto LAB_0010c895;
          }
          psVar17 = psVar17 + -1;
        }
        iter_1 = 0;
        local_1ae0 = (secp256k1_gej *)0x68;
        for (lVar43 = 1; lVar43 != 0xd; lVar43 = lVar43 + 1) {
          local_1ad0 = groupj + lVar43;
          local_1ad8 = group;
          for (uVar15 = 0; (uint)uVar15 != 0xd; uVar15 = uVar15 + 1) {
            iVar8 = skip_section(&iter_1);
            if (iVar8 == 0) {
              uVar34 = uVar15;
              psVar17 = local_1ad8;
              for (uVar33 = 0; uVar33 != 0xd; uVar33 = uVar33 + 1) {
                secp256k1_scalar_set_int((secp256k1_scalar *)&generated,uVar33);
                secp256k1_scalar_set_int(&scalar_i,(uint)uVar15);
                secp256k1_ecmult((secp256k1_gej *)&half,local_1ad0,(secp256k1_scalar *)&generated,
                                 &scalar_i);
                iVar8 = secp256k1_gej_eq_ge_var
                                  ((secp256k1_gej *)&half,psVar17 + (uVar34 / 0xd) * -0xd);
                if (iVar8 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = 
                  "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i * r_log + j) % EXHAUSTIVE_TEST_ORDER])"
                  ;
                  uStack_1b10 = 0x93;
                  goto LAB_0010c895;
                }
                psVar17 = (secp256k1_ge *)((long)(psVar17->x).n + (long)(local_1ae0->x).n);
                uVar34 = uVar34 + lVar43;
              }
            }
            local_1ad8 = local_1ad8 + 1;
          }
          local_1ae0 = (secp256k1_gej *)((local_1ae0->z).n + 1);
        }
        for (lVar43 = 0; lVar43 != 0xd; lVar43 = lVar43 + 1) {
          for (lVar29 = 0; lVar29 != 0xd; lVar29 = lVar29 + 1) {
            iVar8 = skip_section(&iter_1);
            if (iVar8 == 0) {
              secp256k1_scalar_set_int((secp256k1_scalar *)&iter_2,(uint)lVar43);
              psVar17 = group + lVar29;
              secp256k1_ecmult_const((secp256k1_gej *)&half,psVar17,(secp256k1_scalar *)&iter_2);
              psVar22 = group + (ulong)((int)lVar29 * (uint)lVar43) % 0xd;
              iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&half,psVar22);
              if (iVar8 == 0) {
                pcVar31 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                ;
                pcVar37 = 
                "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i * j) % EXHAUSTIVE_TEST_ORDER])"
                ;
                uStack_1b10 = 0xa5;
                goto LAB_0010c895;
              }
              if (lVar29 != 0 && lVar43 != 0) {
                iVar8 = secp256k1_ecmult_const_xonly
                                  ((secp256k1_fe *)&iter,&psVar17->x,(secp256k1_fe *)0x0,
                                   (secp256k1_scalar *)&iter_2,0);
                if (iVar8 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = "test condition failed: ret";
                  uStack_1b10 = 0xaa;
                  goto LAB_0010c895;
                }
                iVar8 = secp256k1_fe_equal((secp256k1_fe *)&iter,&psVar22->x);
                if (iVar8 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = 
                  "test condition failed: secp256k1_fe_equal(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x)"
                  ;
                  uStack_1b10 = 0xab;
                  goto LAB_0010c895;
                }
                do {
                  testutil_random_fe((secp256k1_fe *)&scalar_i);
                  iVar8 = secp256k1_fe_is_zero((secp256k1_fe *)&scalar_i);
                } while (iVar8 != 0);
                secp256k1_fe_mul(&generated.x,(secp256k1_fe *)&scalar_i,&psVar17->x);
                pubkey32 = (uchar *)0x0;
                iVar8 = secp256k1_ecmult_const_xonly
                                  ((secp256k1_fe *)&iter,&generated.x,(secp256k1_fe *)&scalar_i,
                                   (secp256k1_scalar *)&iter_2,0);
                if (iVar8 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = "test condition failed: ret";
                  uStack_1b10 = 0xb1;
                  goto LAB_0010c895;
                }
                iVar8 = secp256k1_fe_equal((secp256k1_fe *)&iter,&psVar22->x);
                if (iVar8 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = 
                  "test condition failed: secp256k1_fe_equal(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x)"
                  ;
                  uStack_1b10 = 0xb2;
                  goto LAB_0010c895;
                }
              }
            }
          }
        }
        iter_2 = 0;
        local_1ac8 = (secp256k1_context *)&local_1ac8->error_callback;
        scratch = (secp256k1_scratch *)checked_malloc((secp256k1_callback *)local_1ac8,0x1020);
        if (scratch != (secp256k1_scratch *)0x0) {
          scratch->alloc_size = 0;
          builtin_memcpy(scratch->magic,"scratch",8);
          scratch->data = scratch + 1;
          scratch->max_size = 0x1000;
        }
        lVar43 = 0;
        local_19a0 = scratch;
        while( true ) {
          if (lVar43 == 0xd) break;
          local_19e8 = lVar43;
          for (lVar43 = 0; lVar43 != 0xd; lVar43 = lVar43 + 1) {
            local_1998 = lVar43;
            lVar29 = 0;
            while (lVar29 != 0xd) {
              local_19e0 = lVar29;
              uVar26 = 0;
              while (uVar26 != 0xd) {
                local_19a8 = uVar26;
                iVar8 = skip_section(&iter_2);
                if (iVar8 == 0) {
                  local_1988 = group + local_19a8;
                  local_1990 = local_19a8 * local_19e8 + local_19e0;
                  uVar26 = 0;
                  while( true ) {
                    if (uVar26 == 0xd) break;
                    secp256k1_scalar_set_int(&half,(uint)local_19e8);
                    secp256k1_scalar_set_int((secp256k1_scalar *)&bStack_11b4,(uint)lVar43);
                    secp256k1_scalar_set_int(&g_sc,(uint)local_19e0);
                    cbdata = (void *)0xd;
                    psVar17 = local_1988;
                    puVar36 = &uStack_11b0;
                    for (pvVar27 = cbdata; pvVar27 != (void *)0x0;
                        pvVar27 = (void *)((long)pvVar27 + -1)) {
                      *puVar36 = (psVar17->x).n[0];
                      psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar46 * -0x10 + 8);
                      puVar36 = puVar36 + (ulong)bVar46 * -2 + 1;
                    }
                    local_1980 = uVar26;
                    psVar17 = group + uVar26;
                    puVar36 = local_1148;
                    for (; cbdata != (void *)0x0; cbdata = (void *)((long)cbdata + -1)) {
                      *puVar36 = (psVar17->x).n[0];
                      psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar46 * -0x10 + 8);
                      puVar36 = puVar36 + (ulong)bVar46 * -2 + 1;
                    }
                    secp256k1_gej_set_infinity((secp256k1_gej *)&scalar_i);
                    if (scratch == (secp256k1_scratch *)0x0) {
LAB_0010b029:
                      secp256k1_ecmult_multi_simple_var
                                ((secp256k1_gej *)&scalar_i,&g_sc,
                                 (secp256k1_ecmult_multi_callback *)&half,cbdata,(size_t)pubkey32);
                    }
                    else {
                      sVar20 = secp256k1_scratch_max_allocation
                                         ((secp256k1_callback *)local_1ac8,scratch,6);
                      pubkey32 = "\x01";
                      cbdata = (void *)0x1;
                      uVar15 = 0;
                      do {
                        if (cbdata == (void *)0xd) break;
                        if (cbdata < (void *)0xd) {
                          uVar34 = *(ulong *)pubkey32;
                        }
                        else {
                          uVar34 = 0;
                        }
                        uVar30 = (ulong)(byte)(0x7f / (byte)((byte)cbdata + 1));
                        uVar38 = (0x98L << ((byte)cbdata & 0x3f)) + uVar30 * 8 + 0x118;
                        if (sVar20 < uVar38) break;
                        uVar38 = (sVar20 - uVar38) / (uVar30 * 8 + 0x108);
                        uVar30 = uVar38;
                        if (uVar34 <= uVar38) {
                          uVar30 = uVar34;
                        }
                        if (uVar15 < uVar30) {
                          uVar15 = uVar30;
                        }
                        pubkey32 = pubkey32 + 8;
                        cbdata = (void *)((long)cbdata + 1);
                      } while (uVar34 <= uVar38);
                      if ((uVar15 == 0) ||
                         (sVar20 = secp256k1_scratch_max_allocation
                                             ((secp256k1_callback *)local_1ac8,scratch,5),
                         sVar20 < 0x70c)) goto LAB_0010b029;
                      local_19d8 = (char **)(ulong)(sVar20 - 0xe18 < 0xfffffffffffff8f4);
                      uVar15 = 2;
                      local_1ad8 = (secp256k1_ge *)(2 - (long)local_19d8);
                      local_1960 = (long)local_19d8 + 1;
                      for (psVar17 = (secp256k1_ge *)0x0; psVar17 != local_1ad8;
                          psVar17 = (secp256k1_ge *)((long)(psVar17->x).n + 1)) {
                        uVar34 = local_1960;
                        if (uVar15 < local_1960) {
                          uVar34 = uVar15;
                        }
                        local_1ad0 = (secp256k1_gej *)((long)psVar17 << ((byte)local_19d8 & 0x3f));
                        sVar20 = secp256k1_scratch_checkpoint
                                           ((secp256k1_callback *)local_1ac8,scratch);
                        secp256k1_gej_set_infinity((secp256k1_gej *)&generated);
                        error_callback = local_1ac8;
                        psVar18 = (secp256k1_gej *)&g_sc;
                        if ((psVar17 == (secp256k1_ge *)0x0) ||
                           (psVar18 = (secp256k1_gej *)0x0, puVar21 = pubkey32, uVar15 != 0)) {
                          local_1978 = psVar18;
                          local_1970 = uVar15;
                          psVar19 = (secp256k1_gej *)
                                    secp256k1_scratch_alloc
                                              ((secp256k1_callback *)local_1ac8,scratch,
                                               uVar34 * 0x98);
                          uVar24 = SUB84(psVar18,0);
                          puVar21 = (uchar *)secp256k1_scratch_alloc
                                                       ((secp256k1_callback *)error_callback,scratch
                                                        ,uVar34 * 4);
                          iter_1 = (uint64_t)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)error_callback,scratch,
                                              uVar34 * 0xc0);
                          local_1968 = (void *)iter_1;
                          psVar22 = (secp256k1_ge *)
                                    secp256k1_scratch_alloc
                                              ((secp256k1_callback *)error_callback,scratch,
                                               uVar34 * 0x1a0);
                          psStack_1a50 = psVar22;
                          local_1a48 = (secp256k1_strauss_point_state *)
                                       secp256k1_scratch_alloc
                                                 ((secp256k1_callback *)error_callback,scratch,
                                                  uVar34 * 0x410);
                          scratch = local_19a0;
                          psVar18 = local_1ad0;
                          auVar47._0_4_ =
                               -(uint)((int)psVar19 == 0 && (int)((ulong)psVar19 >> 0x20) == 0);
                          auVar47._4_4_ =
                               -(uint)((int)puVar21 == 0 && (int)((ulong)puVar21 >> 0x20) == 0);
                          auVar47._8_4_ =
                               -(uint)((int)local_1968 == 0 && (int)((ulong)local_1968 >> 0x20) == 0
                                      );
                          auVar47._12_4_ =
                               -(uint)((int)psVar22 == 0 && (int)((ulong)psVar22 >> 0x20) == 0);
                          iVar8 = movmskps(uVar24,auVar47);
                          local_1ae0 = psVar19;
                          if ((iVar8 != 0) || (local_1a48 == (secp256k1_strauss_point_state *)0x0))
                          {
                            secp256k1_scratch_apply_checkpoint
                                      ((secp256k1_callback *)local_1ac8,local_19a0,sVar20);
                            lVar43 = local_1998;
                            break;
                          }
                          puVar36 = &uStack_11b0 + (long)local_1ad0 * 0xd;
                          for (sVar44 = 0; uVar34 != sVar44; sVar44 = sVar44 + 1) {
                            *(secp256k1_scalar *)(puVar21 + sVar44 * 4) =
                                 (&half)[(long)(psVar18->x).n + sVar44];
                            puVar35 = puVar36;
                            psVar22 = (secp256k1_ge *)&iter;
                            for (lVar43 = 0xd; lVar43 != 0; lVar43 = lVar43 + -1) {
                              (psVar22->x).n[0] = *puVar35;
                              puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
                              psVar22 = (secp256k1_ge *)((long)psVar22 + (ulong)bVar46 * -0x10 + 8);
                            }
                            secp256k1_gej_set_ge(psVar19,(secp256k1_ge *)&iter);
                            psVar19 = psVar19 + 1;
                            puVar36 = puVar36 + 0xd;
                          }
                          psVar18 = local_1ae0;
                          secp256k1_ecmult_strauss_wnaf
                                    ((secp256k1_strauss_state *)&iter_1,(secp256k1_gej *)&generated,
                                     uVar34,local_1ae0,(secp256k1_scalar *)puVar21,
                                     (secp256k1_scalar *)local_1978);
                          scratch = local_19a0;
                          secp256k1_scratch_apply_checkpoint
                                    ((secp256k1_callback *)local_1ac8,local_19a0,sVar20);
                          lVar43 = local_1998;
                          uVar15 = local_1970;
                        }
                        secp256k1_gej_add_var
                                  ((secp256k1_gej *)&scalar_i,(secp256k1_gej *)&scalar_i,
                                   (secp256k1_gej *)&generated,&psVar18->x);
                        uVar15 = uVar15 - uVar34;
                        pubkey32 = puVar21;
                      }
                    }
                    uVar26 = local_1980;
                    iVar8 = secp256k1_gej_eq_ge_var
                                      ((secp256k1_gej *)&scalar_i,
                                       group + (ulong)(uint)((int)local_1980 * (int)lVar43 +
                                                            (int)local_1990) % 0xd);
                    if (iVar8 == 0) {
                      pcVar31 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                      ;
                      pcVar37 = 
                      "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i * x + j * y + k) % EXHAUSTIVE_TEST_ORDER])"
                      ;
                      uStack_1b10 = 0xd9;
                      goto LAB_0010c895;
                    }
                    uVar26 = uVar26 + 1;
                  }
                }
                uVar26 = local_19a8 + 1;
              }
              lVar29 = local_19e0 + 1;
            }
          }
          lVar43 = local_19e8 + 1;
        }
        if (scratch != (secp256k1_scratch *)0x0) {
          iVar8 = secp256k1_memcmp_var(scratch,"scratch",8);
          if (iVar8 == 0) {
            if (scratch->alloc_size != 0) {
              pcVar31 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/scratch_impl.h"
              ;
              pcVar37 = "test condition failed: scratch->alloc_size == 0";
LAB_0010cc20:
              uStack_1b10 = 0x20;
              goto LAB_0010c895;
            }
            free(scratch);
          }
          else {
            (*(ctx->error_callback).fn)("invalid scratch space",(ctx->error_callback).data);
          }
        }
        iter = 0;
        for (uVar33 = 1; uVar33 != 0xd; uVar33 = uVar33 + 1) {
          for (uVar39 = 1; uVar39 != 0xd; uVar39 = uVar39 + 1) {
            iVar8 = skip_section(&iter);
            if (iVar8 == 0) {
              iVar8 = 1;
              do {
                iter_1 = CONCAT44(iter_1._4_4_,iVar8);
                if (0xc < iVar8) break;
                secp256k1_scalar_set_int(&g_sc,uVar33);
                secp256k1_scalar_set_int((secp256k1_scalar *)&iter_2,uVar39);
                psVar17 = &generated;
                secp256k1_scalar_get_b32((uchar *)psVar17,(secp256k1_scalar *)&iter_2);
                secp256k1_scalar_get_b32((uchar *)&scalar_i,&g_sc);
                iVar10 = secp256k1_ecdsa_sign
                                   (ctx,(secp256k1_ecdsa_signature *)&half,(uchar *)&scalar_i,
                                    (uchar *)psVar17,secp256k1_nonce_function_smallint,&iter_1);
                if (iVar10 != 1) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = "test condition failed: ret == 1";
                  uStack_1b10 = 0x135;
                  goto LAB_0010c895;
                }
                secp256k1_ecdsa_signature_load
                          ((secp256k1_context *)&r,&s,&half,(secp256k1_ecdsa_signature *)psVar17);
                r_from_k(&expected_r,group,(int)iter_1,(int *)0x0);
                if (r != expected_r) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = "test condition failed: r == expected_r";
                  uStack_1b10 = 0x13c;
                  goto LAB_0010c895;
                }
                pubkey32 = (uchar *)(_s & 0xffffffff);
                uVar28 = (r * uVar39 + uVar33) % 0xd;
                if (((s * (int)iter_1) % 0xd != uVar28) &&
                   (((0xd - s) * (int)iter_1) % 0xd != uVar28)) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ;
                  pcVar37 = 
                  "test condition failed: (k * s) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER || (k * (EXHAUSTIVE_TEST_ORDER - s)) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER"
                  ;
                  uStack_1b10 = 0x13e;
                  goto LAB_0010c895;
                }
                bVar45 = iVar8 <= (int)iter_1;
                iVar8 = (int)iter_1 + 1;
              } while (bVar45);
            }
          }
        }
        iter_1 = 0;
        for (uVar33 = 1; uVar33 != 0xd; uVar33 = uVar33 + 1) {
          local_1ad0 = (secp256k1_gej *)CONCAT44(local_1ad0._4_4_,uVar33);
          for (uVar39 = 1; uVar39 != 0xd; uVar39 = uVar39 + 1) {
            for (uVar28 = 1; uVar28 != 0xd; uVar28 = uVar28 + 1) {
              local_1ac8 = (secp256k1_context *)CONCAT44(local_1ac8._4_4_,uVar28);
              for (uVar42 = 1; uVar42 != 0xd; uVar42 = uVar42 + 1) {
                iVar8 = skip_section(&iter_1);
                if (iVar8 == 0) {
                  secp256k1_scalar_set_int(&s,uVar33);
                  secp256k1_scalar_set_int(&r,uVar39);
                  secp256k1_scalar_set_int(&g_sc,uVar28);
                  secp256k1_scalar_set_int((secp256k1_scalar *)&iter_2,uVar42);
                  sVar13 = r;
                  uVar41 = 0;
                  for (uVar33 = 0; uVar33 != 0xd; uVar33 = uVar33 + 1) {
                    r_from_k(&half,group,uVar33,(int *)0x0);
                    if (sVar13 == half) {
                      secp256k1_scalar_set_int(&expected_r,uVar33);
                      secp256k1_scalar_mul(&expected_r,&expected_r,&s);
                      secp256k1_scalar_mul(&msg_plus_r_times_sk_s,&r,(secp256k1_scalar *)&iter_2);
                      secp256k1_scalar_add(&msg_plus_r_times_sk_s,&msg_plus_r_times_sk_s,&g_sc);
                      uVar28 = secp256k1_scalar_eq(&expected_r,&msg_plus_r_times_sk_s);
                      uVar41 = uVar41 | uVar28;
                    }
                  }
                  uVar11 = secp256k1_scalar_is_high(&s);
                  secp256k1_ecdsa_signature_save((secp256k1_ecdsa_signature *)&generated,&r,&s);
                  psVar17 = group + (iter_2 & 0xffffffff);
                  psVar22 = (secp256k1_ge *)&half;
                  for (lVar43 = 0xd; lVar43 != 0; lVar43 = lVar43 + -1) {
                    (psVar22->x).n[0] = (psVar17->x).n[0];
                    psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar46 * -0x10 + 8);
                    psVar22 = (secp256k1_ge *)((long)psVar22 + (ulong)bVar46 * -0x10 + 8);
                  }
                  secp256k1_pubkey_save((secp256k1_pubkey *)&scalar_i,(secp256k1_ge *)&half);
                  secp256k1_scalar_get_b32((uchar *)&iter,&g_sc);
                  uVar12 = secp256k1_ecdsa_verify
                                     (ctx,(secp256k1_ecdsa_signature *)&generated,(uchar *)&iter,
                                      (secp256k1_pubkey *)&scalar_i);
                  uVar33 = (uint)local_1ad0;
                  uVar28 = (uint)local_1ac8;
                  if (((uVar11 ^ 1) & uVar41) != uVar12) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ;
                    pcVar37 = 
                    "test condition failed: should_verify == secp256k1_ecdsa_verify(ctx, &sig, msg32, &pk)"
                    ;
                    uStack_1b10 = 0x11a;
                    goto LAB_0010c895;
                  }
                }
              }
            }
          }
        }
        iter_2 = 0;
        for (local_1b00._0_4_ = 1; (uint)local_1b00 != 0xd; local_1b00._0_4_ = (uint)local_1b00 + 1)
        {
          for (uVar33 = 1; iVar8 = 1, uVar33 != 0xd; uVar33 = uVar33 + 1) {
            iVar10 = skip_section(&iter_2);
            if (iVar10 == 0) {
              do {
                _g_sc = CONCAT44(uStack_1aa4,iVar8);
                if (0xc < iVar8) break;
                local_1ac8 = (secp256k1_context *)CONCAT44(local_1ac8._4_4_,iVar8);
                secp256k1_scalar_set_int(&s,(uint)local_1b00);
                secp256k1_scalar_set_int(&r,uVar33);
                secp256k1_scalar_get_b32((uchar *)&iter,&r);
                secp256k1_scalar_get_b32((uchar *)&iter_1,&s);
                sig_00 = secp256k1_nonce_function_smallint;
                secp256k1_ecdsa_sign_recoverable
                          (ctx,(secp256k1_ecdsa_recoverable_signature *)&half,(uchar *)&iter_1,
                           (uchar *)&iter,secp256k1_nonce_function_smallint,&g_sc);
                secp256k1_ecdsa_recoverable_signature_load
                          ((secp256k1_context *)&expected_r,&msg_plus_r_times_sk_s,
                           (secp256k1_scalar *)&recid,(int *)&half,
                           (secp256k1_ecdsa_recoverable_signature *)sig_00);
                r_from_k(&expected_r_1,group,g_sc,&local_19cc);
                sVar13 = msg_plus_r_times_sk_s;
                if (expected_r != expected_r_1) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/recovery/tests_exhaustive_impl.h"
                  ;
                  pcVar37 = "test condition failed: r == expected_r";
                  goto LAB_0010cb3b;
                }
                lVar43 = (long)(int)g_sc;
                uVar39 = expected_r * uVar33 + (uint)local_1b00;
                sig = (secp256k1_ecdsa_signature *)(ulong)uVar39;
                uVar39 = uVar39 % 0xd;
                if (((msg_plus_r_times_sk_s * g_sc) % 0xd != uVar39) &&
                   (((0xd - msg_plus_r_times_sk_s) * g_sc) % 0xd != uVar39)) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/recovery/tests_exhaustive_impl.h"
                  ;
                  pcVar37 = 
                  "test condition failed: (k * s) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER || (k * (EXHAUSTIVE_TEST_ORDER - s)) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER"
                  ;
                  uStack_1b10 = 0x2b;
                  goto LAB_0010c895;
                }
                bVar45 = local_19cc != 0;
                _scalar_i = group[lVar43].y.n[0];
                uStack_17b0 = group[lVar43].y.n[1];
                local_17a8 = *(uchar (*) [4])(group[lVar43].y.n + 2);
                auStack_17a4 = *(uchar (*) [4])((long)group[lVar43].y.n + 0x14);
                auStack_17a0 = *(uchar (*) [4])(group[lVar43].y.n + 3);
                auStack_179c = *(uchar (*) [4])((long)group[lVar43].y.n + 0x1c);
                local_1798 = *(uchar (*) [4])(group[lVar43].y.n + 4);
                auStack_1794 = *(uchar (*) [4])((long)group[lVar43].y.n + 0x24);
                iStack_1790 = group[lVar43].y.magnitude;
                iStack_178c = group[lVar43].y.normalized;
                secp256k1_fe_normalize((secp256k1_fe *)&scalar_i);
                uVar28 = sVar13 * g_sc;
                iVar8 = secp256k1_fe_is_odd((secp256k1_fe *)&scalar_i);
                if (recid != ((uint)(uVar28 % 0xd != uVar39) ^ iVar8 + (uint)bVar45 * 2)) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/recovery/tests_exhaustive_impl.h"
                  ;
                  pcVar37 = "test condition failed: recid == expected_recid";
                  uStack_1b10 = 0x3b;
                  goto LAB_0010c895;
                }
                secp256k1_ecdsa_recoverable_signature_convert
                          (ctx,(secp256k1_ecdsa_signature *)&generated,
                           (secp256k1_ecdsa_recoverable_signature *)&half);
                secp256k1_ecdsa_signature_load
                          ((secp256k1_context *)&expected_r,&msg_plus_r_times_sk_s,
                           (secp256k1_scalar *)&generated,sig);
                r_from_k(&expected_r_1,group,g_sc,(int *)0x0);
                if (expected_r != expected_r_1) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/recovery/tests_exhaustive_impl.h"
                  ;
                  pcVar37 = "test condition failed: r == expected_r";
                  uStack_1b10 = 0x44;
                  goto LAB_0010c895;
                }
                pubkey32 = (uchar *)(ulong)msg_plus_r_times_sk_s;
                uVar39 = (expected_r * uVar33 + (uint)local_1b00) % 0xd;
                if (((msg_plus_r_times_sk_s * g_sc) % 0xd != uVar39) &&
                   (((0xd - msg_plus_r_times_sk_s) * g_sc) % 0xd != uVar39)) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/recovery/tests_exhaustive_impl.h"
                  ;
                  pcVar37 = 
                  "test condition failed: (k * s) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER || (k * (EXHAUSTIVE_TEST_ORDER - s)) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER"
                  ;
                  goto LAB_0010c7da;
                }
                iVar8 = g_sc + 1;
              } while ((int)(uint)local_1ac8 <= (int)g_sc);
            }
          }
        }
        iter_2 = 0;
        for (local_1af8._0_4_ = 1; (uint)local_1af8 != 0xd; local_1af8._0_4_ = (uint)local_1af8 + 1)
        {
          local_1ac8 = (secp256k1_context *)CONCAT44(local_1ac8._4_4_,1);
          while ((uint)local_1ac8 != 0xd) {
            for (uVar33 = 1; uVar39 = 1, uVar33 != 0xd; uVar33 = uVar33 + 1) {
              for (; uVar39 != 0xd; uVar39 = uVar39 + 1) {
                iVar8 = skip_section(&iter_2);
                if (iVar8 == 0) {
                  secp256k1_scalar_set_int(&expected_r,(uint)local_1af8);
                  secp256k1_scalar_set_int(&s,(uint)local_1ac8);
                  secp256k1_scalar_set_int(&r,uVar33);
                  secp256k1_scalar_set_int(&g_sc,uVar39);
                  secp256k1_scalar_get_b32((uchar *)&iter_1,&r);
                  sVar13 = s;
                  uVar42 = 0;
                  for (uVar28 = 0; uVar28 != 0xd; uVar28 = uVar28 + 1) {
                    r_from_k(&half,group,uVar28,(int *)0x0);
                    if (sVar13 == half) {
                      secp256k1_scalar_set_int(&msg_plus_r_times_sk_s,uVar28);
                      secp256k1_scalar_mul
                                (&msg_plus_r_times_sk_s,&msg_plus_r_times_sk_s,&expected_r);
                      secp256k1_scalar_mul(&expected_r_1,&s,&g_sc);
                      secp256k1_scalar_add(&expected_r_1,&expected_r_1,&r);
                      uVar41 = secp256k1_scalar_eq(&msg_plus_r_times_sk_s,&expected_r_1);
                      uVar42 = uVar42 | uVar41;
                    }
                  }
                  uVar28 = secp256k1_scalar_is_high(&expected_r);
                  secp256k1_ecdsa_recoverable_signature_save
                            ((secp256k1_ecdsa_recoverable_signature *)&generated,&s,&expected_r,0);
                  secp256k1_ecdsa_recoverable_signature_convert
                            (ctx,(secp256k1_ecdsa_signature *)&scalar_i,
                             (secp256k1_ecdsa_recoverable_signature *)&generated);
                  psVar17 = group + (_g_sc & 0xffffffff);
                  psVar22 = (secp256k1_ge *)&half;
                  for (lVar43 = 0xd; lVar43 != 0; lVar43 = lVar43 + -1) {
                    (psVar22->x).n[0] = (psVar17->x).n[0];
                    psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar46 * -0x10 + 8);
                    psVar22 = (secp256k1_ge *)((long)psVar22 + (ulong)bVar46 * -0x10 + 8);
                  }
                  secp256k1_pubkey_save((secp256k1_pubkey *)&iter,(secp256k1_ge *)&half);
                  uVar41 = secp256k1_ecdsa_verify
                                     (ctx,(secp256k1_ecdsa_signature *)&scalar_i,(uchar *)&iter_1,
                                      (secp256k1_pubkey *)&iter);
                  if (((uVar28 ^ 1) & uVar42) != uVar41) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/recovery/tests_exhaustive_impl.h"
                    ;
                    pcVar37 = 
                    "test condition failed: should_verify == secp256k1_ecdsa_verify(ctx, &sig, msg32, &pk)"
                    ;
                    uStack_1b10 = 0x88;
                    goto LAB_0010c895;
                  }
                }
              }
            }
            local_1ac8 = (secp256k1_context *)CONCAT44(local_1ac8._4_4_,(uint)local_1ac8 + 1);
          }
        }
        local_1ae0 = (secp256k1_gej *)0x160;
        local_1b00 = (secp256k1_keypair *)&half;
        local_1ac8 = (secp256k1_context *)&generated;
        pubkey = (secp256k1_xonly_pubkey *)&scalar_i;
        local_1af8 = 0;
        local_1ad0 = (secp256k1_gej *)0x0;
        local_1ad8 = (secp256k1_ge *)0xb;
        psVar17 = group;
        for (uVar15 = 1; uVar15 != 0xd; uVar15 = uVar15 + 1) {
          secp256k1_scalar_set_int(&r,(uint)uVar15);
          secp256k1_scalar_get_b32((uchar *)&g_sc,&r);
          iVar8 = secp256k1_keypair_create(ctx,local_1b00,(uchar *)&g_sc);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: secp256k1_keypair_create(ctx, &keypair[i - 1], buf)";
            uStack_1b10 = 0x1f;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_ec_pubkey_create(ctx,(secp256k1_pubkey *)local_1ac8,(uchar *)&g_sc);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: secp256k1_ec_pubkey_create(ctx, &pubkey[i - 1], buf)";
            goto LAB_0010cc20;
          }
          iVar8 = secp256k1_keypair_xonly_pub
                            (ctx,pubkey,(int *)((long)&iter_1 + local_1af8),local_1b00);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parities[i - 1], &keypair[i - 1])"
            ;
            goto LAB_0010d00c;
          }
          puVar21 = (uchar *)((long)&iter + (long)local_1ad0);
          iVar8 = secp256k1_xonly_pubkey_serialize(ctx,puVar21,pubkey);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1])"
            ;
            uStack_1b10 = 0x24;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_xonly_pubkey_parse(ctx,pubkey,puVar21);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_xonly_pubkey_parse(ctx, &xonly_pubkey[i - 1], xonly_pubkey_bytes[i - 1])"
            ;
            uStack_1b10 = 0x27;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&g_sc,pubkey);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1])"
            ;
            uStack_1b10 = 0x28;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_memcmp_var(puVar21,&g_sc,0x20);
          if (iVar8 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0";
LAB_0010cb3b:
            uStack_1b10 = 0x29;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_xonly_pubkey_from_pubkey
                            (ctx,pubkey,(int *)&s,(secp256k1_pubkey *)local_1ac8);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(ctx, &xonly_pubkey[i - 1], &parity, &pubkey[i - 1])"
            ;
            uStack_1b10 = 0x2c;
            goto LAB_0010c895;
          }
          if (s != (&sStack_1a5c)[uVar15]) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: parity == parities[i - 1]";
            goto LAB_0010c9ff;
          }
          iVar8 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&g_sc,pubkey);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1])"
            ;
            uStack_1b10 = 0x2e;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_memcmp_var(puVar21,&g_sc,0x20);
          if (iVar8 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0";
            uStack_1b10 = 0x2f;
            goto LAB_0010c895;
          }
          secp256k1_fe_set_b32_mod((secp256k1_fe *)&iter_2,puVar21);
          iVar8 = secp256k1_fe_equal((secp256k1_fe *)&iter_2,&psVar17[1].x);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: secp256k1_fe_equal(&fe, &group[i].x)";
            uStack_1b10 = 0x33;
            goto LAB_0010c895;
          }
          iter_2 = psVar17[1].y.n[0];
          pvStack_1a10 = (void *)psVar17[1].y.n[1];
          local_1a08 = (undefined4)psVar17[1].y.n[2];
          uStack_1a04 = *(undefined4 *)((long)psVar17[1].y.n + 0x14);
          uStack_1a00 = (undefined4)psVar17[1].y.n[3];
          uStack_19fc = *(undefined4 *)((long)psVar17[1].y.n + 0x1c);
          local_19f8 = (int)psVar17[1].y.n[4];
          uStack_19f4 = *(undefined4 *)((long)psVar17[1].y.n + 0x24);
          iStack_19f0 = psVar17[1].y.magnitude;
          iStack_19ec = psVar17[1].y.normalized;
          secp256k1_fe_normalize_var((secp256k1_fe *)&iter_2);
          sVar13 = secp256k1_fe_is_odd((secp256k1_fe *)&iter_2);
          if (sVar13 != (&sStack_1a5c)[uVar15]) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: secp256k1_fe_is_odd(&fe) == parities[i - 1]";
            uStack_1b10 = 0x38;
            goto LAB_0010c895;
          }
          if (6 < uVar15) {
            iVar8 = secp256k1_memcmp_var(puVar21,(void *)((long)&iter + (long)local_1ae0),0x20);
            if (iVar8 != 0) {
              pcVar31 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
              ;
              pcVar37 = 
              "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], xonly_pubkey_bytes[EXHAUSTIVE_TEST_ORDER - i - 1], 32) == 0"
              ;
              uStack_1b10 = 0x3c;
              goto LAB_0010c895;
            }
            if (sVar13 != 1U - *(int *)((long)&iter_1 + (long)local_1ad8 * 4)) {
              pcVar31 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_exhaustive_impl.h"
              ;
              pcVar37 = 
              "test condition failed: parities[i - 1] == 1 - parities[EXHAUSTIVE_TEST_ORDER - i - 1]"
              ;
              uStack_1b10 = 0x3d;
              goto LAB_0010c895;
            }
          }
          local_1ad8 = (secp256k1_ge *)&local_1ad8[-1].field_0x67;
          local_1ae0 = (secp256k1_gej *)(local_1ae0[-1].z.n + 3);
          local_1ad0 = (secp256k1_gej *)((local_1ad0->x).n + 4);
          local_1af8 = local_1af8 + 4;
          pubkey = pubkey + 1;
          local_1ac8 = (secp256k1_context *)((local_1ac8->ecmult_gen_ctx).ge_offset.y.n + 1);
          local_1b00 = local_1b00 + 1;
          psVar17 = psVar17 + 1;
        }
        for (lVar43 = 0; lVar43 != 0xe0; lVar43 = lVar43 + 0x20) {
          iVar8 = secp256k1_xonly_pubkey_parse
                            (ctx,(secp256k1_xonly_pubkey *)&half,invalid_pubkey_bytes[0] + lVar43);
          if (iVar8 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: !secp256k1_xonly_pubkey_parse(ctx, &pk, invalid_pubkey_bytes[i])"
            ;
            uStack_1b10 = 0xc4;
            goto LAB_0010c895;
          }
        }
        keypair = (secp256k1_keypair *)&half;
        psVar17 = &generated;
        local_1b00 = (secp256k1_keypair *)&iter_2;
        output32 = &scalar_i;
        for (lVar43 = -0xc; lVar43 != 0; lVar43 = lVar43 + 1) {
          secp256k1_scalar_set_int((secp256k1_scalar *)&iter_1,(int)lVar43 + 0xd);
          secp256k1_scalar_get_b32((uchar *)&iter,(secp256k1_scalar *)&iter_1);
          iVar8 = secp256k1_keypair_create(ctx,keypair,(uchar *)&iter);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: secp256k1_keypair_create(ctx, &keypair[i - 1], buf)";
            uStack_1b10 = 0xcd;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_keypair_xonly_pub
                            (ctx,(secp256k1_xonly_pubkey *)psVar17,(int *)local_1b00,keypair);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parity[i - 1], &keypair[i - 1])"
            ;
            uStack_1b10 = 0xce;
            goto LAB_0010c895;
          }
          iVar8 = secp256k1_xonly_pubkey_serialize
                            (ctx,(uchar *)output32,(secp256k1_xonly_pubkey *)psVar17);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar37 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1])"
            ;
            uStack_1b10 = 0xcf;
            goto LAB_0010c895;
          }
          output32 = output32 + 8;
          local_1b00 = (secp256k1_keypair *)((long)local_1b00 + 4);
          psVar17 = (secp256k1_ge *)((psVar17->y).n + 2);
          keypair = keypair + 1;
        }
        _expected_r = 0;
        local_1a68 = (secp256k1_scalar *)0x0;
        _s = 0x8cb36fda;
        p_Stack_1a70 = (secp256k1_nonce_function_hardened)0x0;
        for (local_1b00 = (secp256k1_keypair *)0x1; local_1b00 != (secp256k1_keypair *)0xd;
            local_1b00 = (secp256k1_keypair *)((long)local_1b00 + 1)) {
          iVar8 = 0xd - (int)local_1b00;
          if ((&iStack_1a1c)[(long)local_1b00] == 0) {
            iVar8 = (int)local_1b00;
          }
          for (sVar13 = 1; msg_plus_r_times_sk_s = sVar13, (int)sVar13 < 0xd; sVar13 = sVar13 + 1) {
            local_1a38 = 0;
            uStack_1a30 = 0;
            local_1a48 = (secp256k1_strauss_point_state *)0x0;
            uStack_1a40 = 0;
            iter_1 = 0;
            psStack_1a50 = (secp256k1_ge *)0x0;
            local_1a28 = 0;
            iVar10 = skip_section((uint64_t *)&expected_r);
            if (iVar10 == 0) {
              p_Stack_1a70 = secp256k1_hardened_nonce_function_smallint;
              local_1a68 = &msg_plus_r_times_sk_s;
              sVar40 = 0xd - sVar13;
              if ((&iStack_1a1c)[(int)sVar13] == 0) {
                sVar40 = sVar13;
              }
              iVar10 = 0;
              while (sVar13 = msg_plus_r_times_sk_s, iVar10 < 0xd) {
                testrand256((uchar *)&g_sc);
                pubkey32 = (uchar *)(&scalar_i + ((long)local_1b00 + -1) * 8);
                secp256k1_schnorrsig_challenge
                          (&expected_r_1,rand32 + (long)(int)msg_plus_r_times_sk_s * 0x20,
                           (uchar *)&g_sc,0x20,(uchar *)(&scalar_i + ((long)local_1b00 + -1) * 8));
                uVar15 = (ulong)expected_r_1;
                if (*(int *)((long)&iter_1 + uVar15 * 4) == 0) {
                  recid = (expected_r_1 * iVar8 + sVar40) % 0xd;
                  secp256k1_scalar_get_b32((uchar *)&r,(secp256k1_scalar *)&recid);
                  pubkey32 = (uchar *)(&half + ((long)local_1b00 + -1) * 0x18);
                  iVar14 = secp256k1_schnorrsig_sign_custom
                                     (ctx,(uchar *)&iter,(uchar *)&g_sc,0x20,
                                      (secp256k1_keypair *)(&half + ((long)local_1b00 + -1) * 0x18),
                                      (secp256k1_schnorrsig_extraparams *)&s);
                  if (iVar14 == 0) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
                    ;
                    pcVar37 = 
                    "test condition failed: secp256k1_schnorrsig_sign_custom(ctx, sig64, msg32, sizeof(msg32), &keypairs[d - 1], &extraparams)"
                    ;
                    uStack_1b10 = 0xac;
                    goto LAB_0010c895;
                  }
                  iVar14 = secp256k1_memcmp_var
                                     (&iter,rand32 + (long)(int)msg_plus_r_times_sk_s * 0x20,0x20);
                  if (iVar14 != 0) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
                    ;
                    pcVar37 = 
                    "test condition failed: secp256k1_memcmp_var(sig64, xonly_pubkey_bytes[k - 1], 32) == 0"
                    ;
                    uStack_1b10 = 0xae;
                    goto LAB_0010c895;
                  }
                  iVar14 = secp256k1_memcmp_var(local_1938,&r,0x20);
                  if (iVar14 != 0) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
                    ;
                    pcVar37 = 
                    "test condition failed: secp256k1_memcmp_var(sig64 + 32, expected_s_bytes, 32) == 0"
                    ;
                    uStack_1b10 = 0xb0;
                    goto LAB_0010c895;
                  }
                  *(undefined4 *)((long)&iter_1 + uVar15 * 4) = 1;
                  iVar10 = iVar10 + 1;
                }
              }
            }
          }
        }
        _s = 0;
        for (local_1ad8 = (secp256k1_ge *)0x1; local_1ad8 != (secp256k1_ge *)0x7;
            local_1ad8 = (secp256k1_ge *)((long)(local_1ad8->x).n + 1)) {
          puVar1 = &local_1ad8[-1].field_0x67;
          lVar43 = (long)puVar1 * 0x20;
          _g_sc = *(ulong *)(&scalar_i + (long)puVar1 * 8);
          uStack_1aa0 = (&uStack_17b0)[(long)puVar1 * 4];
          local_1a98 = *(undefined4 *)(local_17a8 + lVar43);
          uStack_1a94 = *(undefined4 *)(auStack_17a4 + lVar43);
          uStack_1a90 = *(undefined4 *)(auStack_17a0 + lVar43);
          uStack_1a8c = *(undefined4 *)(auStack_179c + lVar43);
          iVar8 = 0xd - (int)local_1ad8;
          if ((&iStack_1a1c)[(long)local_1ad8] == 0) {
            iVar8 = (int)local_1ad8;
          }
          local_1ad0 = (secp256k1_gej *)CONCAT44(local_1ad0._4_4_,iVar8);
          puVar21 = (uchar *)((long)&generated.x + (long)puVar1 * 0x40);
          for (local_1ae0 = (secp256k1_gej *)0x1; local_1ae0 != (secp256k1_gej *)0xe;
              local_1ae0 = (secp256k1_gej *)((long)(local_1ae0->x).n + 1)) {
            local_1a38 = 0;
            uStack_1a30 = 0;
            local_1a48 = (secp256k1_strauss_point_state *)0x0;
            uStack_1a40 = 0;
            iter_1 = 0;
            psStack_1a50 = (secp256k1_ge *)0x0;
            local_1a28 = 0;
            iVar8 = skip_section((uint64_t *)&s);
            if (iVar8 == 0) {
              if (local_1ae0 < (secp256k1_gej *)0x7) {
                puVar1 = &local_1ae0[-1].field_0x97;
                lVar43 = (long)puVar1 * 0x20;
                local_1948 = (uchar  [4])*(undefined4 *)(local_17a8 + lVar43);
                auStack_1944 = (uchar  [4])*(undefined4 *)(auStack_17a4 + lVar43);
                auStack_1940 = (uchar  [4])*(undefined4 *)(auStack_17a0 + lVar43);
                auStack_193c = (uchar  [4])*(undefined4 *)(auStack_179c + lVar43);
                iter = *(uint64_t *)(&scalar_i + (long)puVar1 * 8);
                uStack_1950 = (&uStack_17b0)[(long)puVar1 * 4];
                iVar8 = 0xd - (int)local_1ae0;
                if ((&iStack_1a1c)[(long)local_1ae0] == 0) {
                  iVar8 = (int)local_1ae0;
                }
              }
              else {
                local_1948 = (uchar  [4])
                             *(undefined4 *)(secp256k1_ellswift_c4.n + (long)local_1ae0 * 4 + 4);
                auStack_1944 = (uchar  [4])
                               *(undefined4 *)
                                ((long)secp256k1_ellswift_c4.n + (long)local_1ae0 * 0x20 + 0x24);
                auStack_1940 = (uchar  [4])
                               *(undefined4 *)(secp256k1_ellswift_c4.n + (long)local_1ae0 * 4 + 5);
                auStack_193c = (uchar  [4])
                               *(undefined4 *)
                                ((long)secp256k1_ellswift_c4.n + (long)local_1ae0 * 0x20 + 0x2c);
                iter = secp256k1_ellswift_c4.n[(long)local_1ae0 * 4 + 2];
                uStack_1950 = secp256k1_ellswift_c4.n[(long)local_1ae0 * 4 + 3];
                iVar8 = -1;
              }
              local_1ac8 = (secp256k1_context *)((ulong)local_1ac8 & 0xffffffff00000000);
LAB_0010c2aa:
              while ((int)(uint)local_1ac8 < 0xd) {
                testrand256((uchar *)&r);
                pubkey32 = (uchar *)&g_sc;
                secp256k1_schnorrsig_challenge(&expected_r,(uchar *)&iter,(uchar *)&r,0x20,pubkey32)
                ;
                uVar15 = _expected_r & 0xffffffff;
                if (*(int *)((long)&iter_1 + uVar15 * 4) == 0) {
                  iVar10 = (int)_expected_r * (uint)local_1ad0;
                  uVar39 = 0;
                  uVar33 = 0;
                  do {
                    if (uVar33 == 0xe) {
                      testrand256(local_1938);
                      uVar28 = 0;
                    }
                    else {
                      if (uVar33 == 0xf) goto LAB_0010c396;
                      local_1928 = (_func_void_char_ptr_void_ptr *)0x0;
                      local_1938[0] = '\0';
                      local_1938[1] = '\0';
                      local_1938[2] = '\0';
                      local_1938[3] = '\0';
                      local_1938[4] = '\0';
                      local_1938[5] = '\0';
                      local_1938[6] = '\0';
                      local_1938[7] = '\0';
                      local_1938._8_8_ = 0;
                      pvStack_1920 = (void *)((ulong)(byte)uVar33 << 0x38);
                      uVar28 = 0;
                      if (uVar33 != 0xd && iVar8 != -1) {
                        uVar28 = (uint)((uint)(iVar10 + iVar8) % 0xd == uVar33);
                      }
                    }
                    pubkey32 = puVar21;
                    uVar42 = secp256k1_schnorrsig_verify
                                       (ctx,(uchar *)&iter,(uchar *)&r,0x20,
                                        (secp256k1_xonly_pubkey *)puVar21);
                    if (uVar42 != uVar28) {
                      pcVar31 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
                      ;
                      pcVar37 = "test condition failed: valid == expect_valid";
                      uStack_1b10 = 0x7f;
                      goto LAB_0010c895;
                    }
                    uVar39 = uVar39 + uVar28;
                    uVar33 = uVar33 + 1;
                  } while( true );
                }
              }
            }
          }
        }
        psVar17 = group;
        for (lVar43 = -0xc; psVar17 = psVar17 + 1, lVar43 != 0; lVar43 = lVar43 + 1) {
          secp256k1_scalar_set_int((secp256k1_scalar *)&iter_1,(int)lVar43 + 0xd);
          secp256k1_scalar_get_b32((uchar *)&iter,(secp256k1_scalar *)&iter_1);
          iVar8 = secp256k1_ellswift_create(ctx,(uchar *)&generated,(uchar *)&iter,(uchar *)0x0);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: secp256k1_ellswift_create(ctx, ell64, sec32, NULL)";
            uStack_1b10 = 0x1e;
            goto LAB_0010c895;
          }
          secp256k1_ellswift_decode(ctx,(secp256k1_pubkey *)&scalar_i,(uchar *)&generated);
          secp256k1_pubkey_load(ctx,(secp256k1_ge *)&half,(secp256k1_pubkey *)&scalar_i);
          iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)&half,psVar17);
          if (iVar8 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_exhaustive_impl.h"
            ;
            pcVar37 = "test condition failed: secp256k1_ge_eq_var(&ge_decoded, &group[i])";
LAB_0010d00c:
            uStack_1b10 = 0x23;
            goto LAB_0010c895;
          }
        }
        secp256k1_context_destroy(ctx);
      } while( true );
    }
    pcVar31 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_gen_compute_table_impl.h"
    ;
    pcVar37 = "test condition failed: vs_pos == points_total";
    uStack_1b10 = 0x59;
  }
LAB_0010c895:
  fprintf(_stderr,"%s:%d: %s\n",pcVar31,uStack_1b10,pcVar37);
  abort();
LAB_0010c396:
  if (uVar39 != (iVar8 != -1)) {
    pcVar31 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
    ;
    pcVar37 = "test condition failed: count_valid == (actual_k != -1)";
    uStack_1b10 = 0x83;
    goto LAB_0010c895;
  }
  *(undefined4 *)((long)&iter_1 + uVar15 * 4) = 1;
  local_1ac8 = (secp256k1_context *)CONCAT44(local_1ac8._4_4_,(uint)local_1ac8 + 1);
  goto LAB_0010c2aa;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_gej groupj[EXHAUSTIVE_TEST_ORDER];
    secp256k1_ge group[EXHAUSTIVE_TEST_ORDER];
    unsigned char rand32[32];
    secp256k1_context *ctx;

    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    printf("Exhaustive tests for order %lu\n", (unsigned long)EXHAUSTIVE_TEST_ORDER);

    /* find iteration count */
    if (argc > 1) {
        count = strtol(argv[1], NULL, 0);
    }
    printf("test count = %i\n", count);

    /* find random seed */
    testrand_init(argc > 2 ? argv[2] : NULL);

    /* set up split processing */
    if (argc > 4) {
        num_cores = strtol(argv[3], NULL, 0);
        this_core = strtol(argv[4], NULL, 0);
        if (num_cores < 1 || this_core >= num_cores) {
            fprintf(stderr, "Usage: %s [count] [seed] [numcores] [thiscore]\n", argv[0]);
            return 1;
        }
        printf("running tests for core %lu (out of [0..%lu])\n", (unsigned long)this_core, (unsigned long)num_cores - 1);
    }

    /* Recreate the ecmult{,_gen} tables using the right generator (as selected via EXHAUSTIVE_TEST_ORDER) */
    secp256k1_ecmult_gen_compute_table(&secp256k1_ecmult_gen_prec_table[0][0], &secp256k1_ge_const_g, COMB_BLOCKS, COMB_TEETH, COMB_SPACING);
    secp256k1_ecmult_compute_two_tables(secp256k1_pre_g, secp256k1_pre_g_128, WINDOW_G, &secp256k1_ge_const_g);

    while (count--) {
        /* Build context */
        ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
        testrand256(rand32);
        CHECK(secp256k1_context_randomize(ctx, rand32));

        /* Generate the entire group */
        secp256k1_gej_set_infinity(&groupj[0]);
        secp256k1_ge_set_gej(&group[0], &groupj[0]);
        for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_gej_add_ge(&groupj[i], &groupj[i - 1], &secp256k1_ge_const_g);
            secp256k1_ge_set_gej(&group[i], &groupj[i]);
            if (count != 0) {
                /* Set a different random z-value for each Jacobian point, except z=1
                   is used in the last iteration. */
                secp256k1_fe z;
                testutil_random_fe(&z);
                secp256k1_gej_rescale(&groupj[i], &z);
            }

            /* Verify against ecmult_gen */
            {
                secp256k1_scalar scalar_i;
                secp256k1_gej generatedj;
                secp256k1_ge generated;

                secp256k1_scalar_set_int(&scalar_i, i);
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &generatedj, &scalar_i);
                secp256k1_ge_set_gej(&generated, &generatedj);

                CHECK(group[i].infinity == 0);
                CHECK(generated.infinity == 0);
                CHECK(secp256k1_fe_equal(&generated.x, &group[i].x));
                CHECK(secp256k1_fe_equal(&generated.y, &group[i].y));
            }
        }

        /* Run the tests */
        test_exhaustive_endomorphism(group);
        test_exhaustive_addition(group, groupj);
        test_exhaustive_ecmult(group, groupj);
        test_exhaustive_ecmult_multi(ctx, group);
        test_exhaustive_sign(ctx, group);
        test_exhaustive_verify(ctx, group);

#ifdef ENABLE_MODULE_RECOVERY
        test_exhaustive_recovery(ctx, group);
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
        test_exhaustive_extrakeys(ctx, group);
#endif
#ifdef ENABLE_MODULE_SCHNORRSIG
        test_exhaustive_schnorrsig(ctx);
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    /* The ellswift algorithm does have additional edge cases when operating on
     * curves of even order, which are not included in the code as secp256k1 is
     * of odd order. Skip the ellswift tests if the used exhaustive tests curve
     * is even-ordered accordingly. */
    #if !EXHAUSTIVE_TEST_CURVE_HAS_EVEN_ORDER
        test_exhaustive_ellswift(ctx, group);
    #endif
#endif

        secp256k1_context_destroy(ctx);
    }

    testrand_finish();

    printf("no problems found\n");
    return 0;
}